

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

Node * makeVariable(char *name)

{
  Node *pNVar1;
  Node *pNVar2;
  int iVar3;
  Node *pNVar4;
  char *pcVar5;
  
  pNVar2 = (Node *)(Node *)&thisRule->rule;
  if (thisRule == (Node *)0x0) {
    __assert_fail("thisRule",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0x66,"Node *makeVariable(char *)");
  }
  pNVar1 = (thisRule->rule).variables;
  pNVar4 = pNVar1;
  while( true ) {
    if (pNVar4 == (Node *)0x0) {
      pNVar4 = (Node *)calloc(1,0x30);
      pNVar4->type = 2;
      pcVar5 = strdup(name);
      (pNVar4->rule).name = pcVar5;
      (pNVar4->rule).next = pNVar1;
      (pNVar2->rule).variables = pNVar4;
      return pNVar4;
    }
    iVar3 = strcmp(name,(pNVar4->rule).name);
    if (iVar3 == 0) break;
    pNVar4 = (pNVar4->rule).next;
  }
  return pNVar4;
}

Assistant:

Node *makeVariable(char *name)
{
  Node *node;
  assert(thisRule);
  for (node= thisRule->rule.variables;  node;  node= node->variable.next)
    if (!strcmp(name, node->variable.name))
      return node;
  node= newNode(Variable);
  node->variable.name= strdup(name);
  node->variable.next= thisRule->rule.variables;
  thisRule->rule.variables= node;
  return node;
}